

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_EndpointType.cpp
# Opt level: O0

InterpolationType soul::parseInterpolationType<soul::heart::Parser>(Parser *tokeniser)

{
  Parser *pPVar1;
  bool bVar2;
  CompileMessage local_50;
  Parser *local_18;
  Parser *tokeniser_local;
  
  local_18 = tokeniser;
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIfKeywordOrIdentifier
                    (&tokeniser->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,"none");
  if (bVar2) {
    tokeniser_local._4_4_ = none;
  }
  else {
    bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIfKeywordOrIdentifier
                      (&local_18->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,"latch");
    if (bVar2) {
      tokeniser_local._4_4_ = latch;
    }
    else {
      bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIfKeywordOrIdentifier
                        (&local_18->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,"linear");
      if (bVar2) {
        tokeniser_local._4_4_ = linear;
      }
      else {
        bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIfKeywordOrIdentifier
                          (&local_18->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,"sinc");
        if (bVar2) {
          tokeniser_local._4_4_ = sinc;
        }
        else {
          bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ::matchIfKeywordOrIdentifier
                            (&local_18->
                              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                             ,"fast");
          if (bVar2) {
            tokeniser_local._4_4_ = fast;
          }
          else {
            bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ::matchIfKeywordOrIdentifier
                              (&local_18->
                                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                               ,"best");
            pPVar1 = local_18;
            if (bVar2) {
              tokeniser_local._4_4_ = best;
            }
            else {
              Errors::expectedInterpolationType<>();
              (*(pPVar1->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                )._vptr_Tokeniser[2])(pPVar1,&local_50);
              CompileMessage::~CompileMessage(&local_50);
              tokeniser_local._4_4_ = none;
            }
          }
        }
      }
    }
  }
  return tokeniser_local._4_4_;
}

Assistant:

static InterpolationType parseInterpolationType (TokeniserType& tokeniser)
{
    if (tokeniser.matchIfKeywordOrIdentifier ("none"))   return InterpolationType::none;
    if (tokeniser.matchIfKeywordOrIdentifier ("latch"))  return InterpolationType::latch;
    if (tokeniser.matchIfKeywordOrIdentifier ("linear")) return InterpolationType::linear;
    if (tokeniser.matchIfKeywordOrIdentifier ("sinc"))   return InterpolationType::sinc;
    if (tokeniser.matchIfKeywordOrIdentifier ("fast"))   return InterpolationType::fast;
    if (tokeniser.matchIfKeywordOrIdentifier ("best"))   return InterpolationType::best;

    tokeniser.throwError (Errors::expectedInterpolationType());
    return InterpolationType::none;
}